

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::Char3Mixin::Print(Char3Mixin *this,DebugWriter *w,char16 *litbuf)

{
  DebugWriter::Print(w,L"c0: ");
  DebugWriter::PrintQuotedChar(w,this->cs[0]);
  DebugWriter::Print(w,L", c1: ");
  DebugWriter::PrintQuotedChar(w,this->cs[1]);
  DebugWriter::Print(w,L", c2: ");
  DebugWriter::PrintQuotedChar(w,this->cs[2]);
  return;
}

Assistant:

void Char3Mixin::Print(DebugWriter* w, const char16* litbuf) const
    {
        w->Print(_u("c0: "));
        w->PrintQuotedChar(cs[0]);
        w->Print(_u(", c1: "));
        w->PrintQuotedChar(cs[1]);
        w->Print(_u(", c2: "));
        w->PrintQuotedChar(cs[2]);
    }